

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  size_t size;
  size_t in_stack_00000020;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  size_t in_stack_00000050;
  size_t in_stack_00000058;
  ulong local_10;
  
  readme_pack();
  failure_rate_binary_fuse16();
  local_10 = 1000;
  while( true ) {
    if (1000000 < local_10) {
      _Var1 = testbinaryfuse8(in_stack_00000058,in_stack_00000050);
      if (!_Var1) {
        abort();
      }
      _Var1 = testbinaryfuse8(in_stack_00000058,in_stack_00000050);
      if (!_Var1) {
        abort();
      }
      _Var1 = testbinaryfuse8(in_stack_00000058,in_stack_00000050);
      if (!_Var1) {
        abort();
      }
      _Var1 = testbinaryfuse16(in_stack_00000058,in_stack_00000050);
      if (!_Var1) {
        abort();
      }
      _Var1 = testbinaryfuse16(in_stack_00000058,in_stack_00000050);
      if (!_Var1) {
        abort();
      }
      _Var1 = testbinaryfuse16(in_stack_00000058,in_stack_00000050);
      if (!_Var1) {
        abort();
      }
      return 0;
    }
    printf("== size = %zu \n",local_10);
    _Var1 = testbinaryfuse8(in_stack_00000058,in_stack_00000050);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbinaryfuse16(in_stack_00000058,in_stack_00000050);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbinaryfuse8pack(in_stack_00000040,in_stack_00000038);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbinaryfuse16pack(in_stack_00000040,in_stack_00000038);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbinaryfuse8(in_stack_00000058,in_stack_00000050);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbinaryfuse16(in_stack_00000058,in_stack_00000050);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbufferedxor8(in_stack_00000020);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testbufferedxor16(in_stack_00000020);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testxor8(in_stack_00000020);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testxor16(in_stack_00000020);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testxor8pack(in_stack_00000020);
    if (!_Var1) {
      abort();
    }
    printf("\n");
    _Var1 = testxor16pack(in_stack_00000020);
    if (!_Var1) break;
    printf("\n");
    printf("======\n");
    local_10 = local_10 * 300;
  }
  abort();
}

Assistant:

int main() {
  readme_pack();
  failure_rate_binary_fuse16();
  for(size_t size = 1000; size <= 1000000; size *= 300) {
    printf("== size = %zu \n", size);
    if(!testbinaryfuse8(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse16(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse8pack(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse16pack(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse8(size, 10)) { abort(); }
    printf("\n");
    if(!testbinaryfuse16(size, 10)) { abort(); }
    printf("\n");
    if(!testbufferedxor8(size)) { abort(); }
    printf("\n");
    if(!testbufferedxor16(size)) { abort(); }
    printf("\n");
    if(!testxor8(size)) { abort(); }
    printf("\n");
    if(!testxor16(size)) { abort(); }
    printf("\n");
    if(!testxor8pack(size)) { abort(); }
    printf("\n");
    if(!testxor16pack(size)) { abort(); }
    printf("\n");
    printf("======\n");
  }

  // test small edge-case binary fuse input sizes
  if(!testbinaryfuse8(0, 0)) { abort(); }
  if(!testbinaryfuse8(1, 0)) { abort(); }
  if(!testbinaryfuse8(2, 0)) { abort(); }
  if(!testbinaryfuse16(0, 0)) { abort(); }
  if(!testbinaryfuse16(1, 0)) { abort(); }
  if(!testbinaryfuse16(2, 0)) { abort(); }
}